

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

int CfdGetSupportedFunction(uint64_t *support_flag)

{
  uint64_t uVar1;
  
  cfd::Initialize();
  if (support_flag != (uint64_t *)0x0) {
    uVar1 = cfd::GetSupportedFunction();
    *support_flag = uVar1;
  }
  return (uint)(support_flag == (uint64_t *)0x0);
}

Assistant:

int CfdGetSupportedFunction(uint64_t* support_flag) {
  try {
    cfd::Initialize();
    if (support_flag == nullptr) return kCfdIllegalArgumentError;
    *support_flag = cfd::GetSupportedFunction();
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}